

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O3

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint _h;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  undefined4 *puVar18;
  undefined4 *puVar19;
  ulong uVar20;
  int _w;
  ulong local_80;
  undefined4 *local_70;
  
  uVar1 = bottom_blob->c;
  iVar9 = this->stride;
  uVar8 = (long)bottom_blob->w / (long)iVar9;
  _h = bottom_blob->h / iVar9;
  _w = (int)uVar8;
  Mat::create(top_blob,_w,_h,uVar1 * iVar9 * iVar9,bottom_blob->elemsize,opt->blob_allocator);
  iVar9 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < (int)uVar1) {
      local_70 = (undefined4 *)bottom_blob->data;
      sVar3 = bottom_blob->elemsize;
      uVar2 = this->stride;
      lVar14 = (long)bottom_blob->w * sVar3;
      sVar4 = bottom_blob->cstep;
      local_80 = 0;
      do {
        if (0 < (int)uVar2) {
          pvVar5 = top_blob->data;
          sVar6 = top_blob->cstep;
          sVar7 = top_blob->elemsize;
          uVar11 = 0;
          puVar19 = local_70;
          do {
            iVar9 = this->stride;
            uVar20 = 0;
            puVar18 = puVar19;
            do {
              if (0 < (int)_h) {
                puVar16 = (undefined4 *)
                          ((uVar20 + (long)(int)((uVar2 * (int)local_80 + (int)uVar11) * uVar2)) *
                           sVar6 * sVar7 + (long)pvVar5);
                uVar10 = 0;
                puVar15 = puVar18;
                do {
                  uVar13 = uVar8 & 0xffffffff;
                  puVar17 = puVar15;
                  if (0 < _w) {
                    do {
                      *puVar16 = *puVar17;
                      puVar16 = puVar16 + 1;
                      puVar17 = puVar17 + iVar9;
                      uVar12 = (int)uVar13 - 1;
                      uVar13 = (ulong)uVar12;
                    } while (uVar12 != 0);
                  }
                  uVar10 = uVar10 + 1;
                  puVar15 = (undefined4 *)((long)puVar15 + lVar14 * iVar9);
                } while (uVar10 != _h);
              }
              uVar20 = uVar20 + 1;
              puVar18 = puVar18 + 1;
            } while (uVar20 != uVar2);
            uVar11 = uVar11 + 1;
            puVar19 = (undefined4 *)((long)puVar19 + lVar14);
          } while (uVar11 != uVar2);
        }
        local_80 = local_80 + 1;
        local_70 = (undefined4 *)((long)local_70 + sVar3 * sVar4);
      } while (local_80 != uVar1);
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                float* outptr = top_blob.channel(q*stride*stride + sh*stride + sw);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i*stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}